

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertions.cpp
# Opt level: O0

void cgreen::assert_that_
               (char *file,int line,char *actual_string,string *actual,Constraint *constraint)

{
  _Bool _Var1;
  Constraint *in_R8;
  intptr_t in_stack_00000048;
  char *in_stack_00000050;
  int in_stack_0000005c;
  char *in_stack_00000060;
  
  _Var1 = is_string_comparing(in_R8);
  if (_Var1) {
    std::__cxx11::string::c_str();
    assert_core_(in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                 (Constraint *)file);
  }
  else {
    assert_core_(in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                 (Constraint *)file);
  }
  return;
}

Assistant:

void assert_that_(const char *file, int line, const char *actual_string,
                      const std::string *actual, Constraint* constraint) {

        // if they are using a string constraint, they are almost certainly meaning to do a deep comparison
        if (is_string_comparing(constraint)) {
            assert_core_(file, line, actual_string, (intptr_t) (actual->c_str()),
                         constraint);
            return;
        }

        assert_core_(file, line, actual_string, (intptr_t) actual, constraint);
    }